

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.hpp
# Opt level: O0

size_t interpolative_internal::encode(uint32_t *f,uint32_t *in_buf,size_t n,size_t u)

{
  size_t sVar1;
  long in_RCX;
  uint32_t *in_RDI;
  size_t high;
  size_t low;
  bit_stream os;
  size_t in_stack_ffffffffffffff70;
  size_t in_stack_ffffffffffffff78;
  bit_stream *in_stack_ffffffffffffff90;
  
  bit_stream::bit_stream((bit_stream *)&stack0xffffffffffffff90,in_RDI,true);
  encode_interpolative
            (in_stack_ffffffffffffff90,(uint32_t *)0x1,in_RCX + 1,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffff70);
  sVar1 = bit_stream::flush((bit_stream *)&stack0xffffffffffffff90);
  bit_stream::~bit_stream((bit_stream *)0x1810cb);
  return sVar1;
}

Assistant:

static inline size_t encode(
        uint32_t* f, const uint32_t* in_buf, size_t n, size_t u)
    {
        bit_stream os(f, true);
        size_t low = 1;
        size_t high = u + 1;
        encode_interpolative(os, in_buf, n, low, high);
        return os.flush();
    }